

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

Node * getfreepos(Table *t)

{
  Table *t_local;
  
  if (t->lastfree == (Node *)0x0) {
LAB_0015739a:
    t_local = (Table *)0x0;
  }
  else {
    do {
      if (t->lastfree <= t->node) goto LAB_0015739a;
      t->lastfree = t->lastfree + -1;
    } while ((t->lastfree->u).key_tt != '\0');
    t_local = (Table *)t->lastfree;
  }
  return (Node *)t_local;
}

Assistant:

static Node *getfreepos (Table *t) {
  if (!isdummy(t)) {
    while (t->lastfree > t->node) {
      t->lastfree--;
      if (keyisnil(t->lastfree))
        return t->lastfree;
    }
  }
  return NULL;  /* could not find a free place */
}